

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O2

void __thiscall higan::EventLoopThreadPool::Start(EventLoopThreadPool *this)

{
  EventLoopThreadPool *__lhs;
  EventLoopThread *pEVar1;
  long lVar2;
  Logger local_390;
  Fmt local_178;
  string local_78;
  EventLoopThread *local_58;
  long local_50;
  vector<higan::EventLoop*,std::allocator<higan::EventLoop*>> *local_48;
  EventLoopThreadPool *local_40;
  EventLoopThread *local_38;
  
  if (this->running_ == true) {
    Logger::Logger(&local_390,FATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/EventLoopThreadPool.cpp"
                   ,0x1e,"Start");
    Fmt::Fmt(&local_178,"EventLoopThreadPool %s is running",(this->name_)._M_dataplus._M_p);
    Logger::operator<<(&local_390,&local_178);
    Logger::~Logger(&local_390);
  }
  this->running_ = true;
  local_48 = (vector<higan::EventLoop*,std::allocator<higan::EventLoop*>> *)&this->event_loops_;
  local_40 = this;
  for (lVar2 = 0; __lhs = local_40, lVar2 < local_40->thread_num_; lVar2 = lVar2 + 1) {
    local_38 = (EventLoopThread *)operator_new(0x150);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   &__lhs->name_,"@thread-");
    std::__cxx11::to_string(&local_78,(int)lVar2);
    local_50 = lVar2;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_390,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   &local_78);
    pEVar1 = local_38;
    EventLoopThread::EventLoopThread
              (local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_390);
    local_58 = pEVar1;
    std::
    vector<std::unique_ptr<higan::EventLoopThread,std::default_delete<higan::EventLoopThread>>,std::allocator<std::unique_ptr<higan::EventLoopThread,std::default_delete<higan::EventLoopThread>>>>
    ::emplace_back<higan::EventLoopThread*>
              ((vector<std::unique_ptr<higan::EventLoopThread,std::default_delete<higan::EventLoopThread>>,std::allocator<std::unique_ptr<higan::EventLoopThread,std::default_delete<higan::EventLoopThread>>>>
                *)&this->threads_,&local_58);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_178);
    lVar2 = local_50;
    local_390.buffer_.buffer_._0_8_ =
         EventLoopThread::GetEventLoop
                   ((EventLoopThread *)
                    (this->threads_).
                    super__Vector_base<std::unique_ptr<higan::EventLoopThread,_std::default_delete<higan::EventLoopThread>_>,_std::allocator<std::unique_ptr<higan::EventLoopThread,_std::default_delete<higan::EventLoopThread>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_50]._M_t.
                    super___uniq_ptr_impl<higan::EventLoopThread,_std::default_delete<higan::EventLoopThread>_>
                   );
    std::vector<higan::EventLoop*,std::allocator<higan::EventLoop*>>::
    emplace_back<higan::EventLoop*>(local_48,(EventLoop **)&local_390);
  }
  return;
}

Assistant:

void EventLoopThreadPool::Start()
{
	if (running_)
	{
		LOG_FATAL << higan::Fmt("EventLoopThreadPool %s is running", name_.c_str());
	}

	running_ = true;

	for (int i = 0; i < thread_num_; ++i)
	{
		threads_.emplace_back(new EventLoopThread(name_ + "@thread-" + std::to_string(i)));
		event_loops_.push_back(threads_[i]->GetEventLoop());
	}
}